

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  UI *ui;
  char **argv_local;
  int argc_local;
  
  set_signals();
  ui = (UI *)(ulong)(uint)argc;
  getargs(argc,argv);
  open_files();
  reader(ui,(UI_STRING *)argv);
  lr0();
  lalr();
  make_parser();
  verbose();
  output();
  done(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    set_signals();
    getargs(argc, argv);
    open_files();
    reader();
    lr0();
    lalr();
    make_parser();
    verbose();
    output();
    done(0);
    return 0;
}